

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O2

YearMonthDay __thiscall QMilankovicCalendar::julianDayToDate(QMilankovicCalendar *this,qint64 jd)

{
  int iVar1;
  R_conflict15 RVar2;
  R_conflict15 RVar3;
  R_conflict15 RVar4;
  R_conflict20 RVar5;
  YearMonthDay YVar6;
  
  RVar2 = QRoundingDown::qDivMod<328718U,_long_long,_true>(jd * 9 + -0xec5c1e);
  RVar3 = QRoundingDown::qDivMod<9U,_long_long,_true>(RVar2.remainder);
  RVar3 = QRoundingDown::qDivMod<36525U,_long_long,_true>(RVar3.quotient * 100 + 99);
  RVar4 = QRoundingDown::qDivMod<100U,_long_long,_true>(RVar3.remainder);
  RVar5 = QRomanCalendrical::dayInYearToYmd((int)RVar4.quotient);
  YVar6.day = RVar5.day;
  iVar1 = RVar5.year + (int)RVar3.quotient + (int)RVar2.quotient * 100;
  YVar6._0_8_ = RVar5._0_8_ & 0xffffffff00000000 | (ulong)(iVar1 - (uint)(iVar1 < 1));
  return YVar6;
}

Assistant:

QCalendar::YearMonthDay  QMilankovicCalendar::julianDayToDate(qint64 jd) const
{
    const auto century9Day = qDivMod<NineCenturies>(9 * (jd - MilankovicBaseJd) - 7);
    // Its remainder changes by 9 per day, except roughly once per century.
    const auto year100Day = qDivMod<LeapCentury>(100 * qDiv<9>(century9Day.remainder) + 99);
    // Its remainder changes by 100 per day, except roughly once per year.
    const auto ymd = dayInYearToYmd(qDiv<100>(year100Day.remainder));
    const int y = 100 * century9Day.quotient + year100Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}